

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O2

uint64 CityHash64(char *s,size_t len)

{
  uint64 uVar1;
  ulong uVar2;
  uint64 uVar3;
  long lVar4;
  char *s_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  pair<unsigned_long,_unsigned_long> pVar11;
  pair<unsigned_long,_unsigned_long> pVar12;
  unsigned_long local_40;
  uint64 local_38;
  
  if (len < 0x21) {
    if (len < 0x11) {
      uVar1 = HashLen0to16(s,len);
      return uVar1;
    }
    lVar4 = len * 2 + -0x651e95c4d06fbfb1;
    uVar5 = *(long *)(s + (len - 8)) * lVar4;
    uVar6 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar2 = (uVar2 << 0x2e | uVar2 >> 0x12) + *(long *)s * -0x4b6d499041670d8d + uVar5;
    uVar6 = ((uVar5 << 0x22 | uVar5 >> 0x1e) + (uVar6 * 0x200000 | uVar6 >> 0x2b) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar2) * lVar4;
    uVar6 = (uVar6 >> 0x2f ^ uVar2 ^ uVar6) * lVar4;
    uVar1 = (uVar6 >> 0x2f ^ uVar6) * lVar4;
  }
  else {
    if (0x40 < len) {
      uVar6 = *(long *)(s + (len - 0x38)) + *(long *)(s + (len - 0x10));
      uVar1 = *(uint64 *)(s + (len - 0x28));
      local_38 = HashLen16(*(long *)(s + (len - 0x30)) + len,*(uint64 *)(s + (len - 0x18)));
      pVar11 = WeakHashLen32WithSeeds(s + (len - 0x40),len,local_38);
      pVar12 = WeakHashLen32WithSeeds(s + (len - 0x20),uVar6 + 0xb492b66fbe98f273,uVar1);
      lVar10 = uVar1 * -0x4b6d499041670d8d + *(long *)s;
      s_00 = s + 0x20;
      lVar4 = -(len - 1 & 0xffffffffffffffc0);
      do {
        local_40 = pVar11.second;
        uVar2 = lVar10 + pVar11.first + uVar6 + *(long *)(s_00 + -0x18);
        uVar6 = uVar6 + local_40 + *(long *)(s_00 + 0x10);
        uVar5 = (uVar2 * 0x8000000 | uVar2 >> 0x25) * -0x4b6d499041670d8d ^ pVar12.second;
        uVar6 = pVar11.first + *(long *)(s_00 + 8) +
                (uVar6 * 0x400000 | uVar6 >> 0x2a) * -0x4b6d499041670d8d;
        uVar2 = local_38 + pVar12.first;
        lVar10 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x4b6d499041670d8d;
        pVar11 = WeakHashLen32WithSeeds
                           (s_00 + -0x20,local_40 * -0x4b6d499041670d8d,pVar12.first + uVar5);
        pVar12 = WeakHashLen32WithSeeds(s_00,pVar12.second + lVar10,*(long *)(s_00 + -0x10) + uVar6)
        ;
        s_00 = s_00 + 0x40;
        lVar4 = lVar4 + 0x40;
        local_38 = uVar5;
      } while (lVar4 != 0);
      uVar1 = HashLen16(pVar11.first,pVar12.first);
      uVar3 = HashLen16(pVar11.second,pVar12.second);
      uVar1 = HashLen16((uVar6 >> 0x2f ^ uVar6) * -0x4b6d499041670d8d + uVar5 + uVar1,lVar10 + uVar3
                       );
      return uVar1;
    }
    lVar4 = len * 2 + -0x651e95c4d06fbfb1;
    uVar6 = *(ulong *)(s + 8);
    lVar8 = *(long *)(s + 0x18) * 9;
    lVar10 = *(long *)(s + (len - 0x18));
    uVar5 = *(long *)s * -0x651e95c4d06fbfb1 + *(long *)(s + (len - 8));
    uVar2 = *(long *)(s + 0x10) * -0x651e95c4d06fbfb1 + lVar8;
    uVar7 = uVar5 ^ *(ulong *)(s + (len - 0x20));
    uVar5 = (uVar7 + lVar8 + 1 +
            ((uVar6 << 0x22 | uVar6 >> 0x1e) + lVar10) * 9 + (uVar5 * 0x200000 | uVar5 >> 0x2b)) *
            lVar4;
    lVar9 = (uVar2 * 0x400000 | uVar2 >> 0x2a) + lVar10;
    uVar5 = (*(long *)(s + (len - 0x10)) * lVar4 + lVar8 + uVar7 + 1 +
            (uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
             (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
             (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38)) * lVar4;
    uVar5 = (*(long *)(s + (len - 8)) + uVar2 + lVar10 + lVar9 +
            (uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
             (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
             (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38)) * lVar4;
    uVar6 = *(long *)(s + (len - 0x10)) * lVar4 + *(ulong *)(s + (len - 0x20)) +
            (uVar2 + lVar10 + uVar6 +
            (uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
             (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
             (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38)) * lVar4;
    uVar1 = (uVar6 >> 0x2f ^ uVar6) * lVar4 + lVar9;
  }
  return uVar1;
}

Assistant:

uint64 CityHash64(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return HashLen0to16(s, len);
    } else {
      return HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  }

  // For strings over 64 bytes we hash the end first, and then as we
  // loop we keep 56 bytes of state: v, w, x, y, and z.
  uint64 x = Fetch64(s + len - 40);
  uint64 y = Fetch64(s + len - 16) + Fetch64(s + len - 56);
  uint64 z = HashLen16(Fetch64(s + len - 48) + len, Fetch64(s + len - 24));
  pair<uint64, uint64> v = WeakHashLen32WithSeeds(s + len - 64, len, z);
  pair<uint64, uint64> w = WeakHashLen32WithSeeds(s + len - 32, y + k1, x);
  x = x * k1 + Fetch64(s);

  // Decrease len to the nearest multiple of 64, and operate on 64-byte chunks.
  len = (len - 1) & ~static_cast<size_t>(63);
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 64;
  } while (len != 0);
  return HashLen16(HashLen16(v.first, w.first) + ShiftMix(y) * k1 + z,
                   HashLen16(v.second, w.second) + x);
}